

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QUrl>::pop_front(QList<QUrl> *this)

{
  QUrl **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  
  pDVar3 = (this->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QUrl>::reallocateAndGrow(&this->d,GrowsAtEnd,0,(QArrayDataPointer<QUrl> *)0x0)
    ;
  }
  QUrl::~QUrl((this->d).ptr);
  ppQVar1 = &(this->d).ptr;
  *ppQVar1 = *ppQVar1 + 1;
  pqVar2 = &(this->d).size;
  *pqVar2 = *pqVar2 + -1;
  return;
}

Assistant:

void pop_front() noexcept { removeFirst(); }